

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::
CmpHelperEQFailure<std::vector<CLI::App*,std::allocator<CLI::App*>>,std::vector<CLI::App*,std::allocator<CLI::App*>>>
          (internal *this,char *lhs_expression,char *rhs_expression,
          vector<CLI::App_*,_std::allocator<CLI::App_*>_> *lhs,
          vector<CLI::App_*,_std::allocator<CLI::App_*>_> *rhs)

{
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *value;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar1;
  string local_60;
  string local_40;
  
  PrintToString<std::vector<CLI::App*,std::allocator<CLI::App*>>>
            (&local_40,(testing *)lhs,
             (vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)rhs_expression);
  PrintToString<std::vector<CLI::App*,std::allocator<CLI::App*>>>(&local_60,(testing *)rhs,value);
  EqFailure(this,lhs_expression,rhs_expression,(string *)&local_40,(string *)&local_60,false);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  AVar1.message_.ptr_ = extraout_RDX.ptr_;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}